

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O0

void __thiscall jsoncons::not_an_object::~not_an_object(not_an_object *this)

{
  not_an_object *in_stack_00000010;
  
  ~not_an_object(in_stack_00000010);
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }